

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

int snprintf_error_data(char *buf,size_t len,uint8_t err,char **arr,int arr_len)

{
  int iVar1;
  long in_RCX;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int tmp_n;
  int count;
  int n;
  int i;
  int local_38;
  int local_34;
  int local_30;
  int local_4;
  
  local_34 = 0;
  local_38 = 0;
  if ((in_DL == 0) || (in_RSI == 0)) {
    local_4 = 0;
  }
  else {
    for (local_30 = 0; local_30 < in_R8D; local_30 = local_30 + 1) {
      if (((uint)in_DL & 1 << ((byte)local_30 & 0x1f)) != 0) {
        if (local_38 != 0) {
          iVar1 = snprintf((char *)(in_RDI + local_34),in_RSI - local_34,",");
          if ((iVar1 < 0) || ((ulong)(in_RSI - local_34) <= (ulong)(long)iVar1)) {
            return local_34;
          }
          local_34 = iVar1 + local_34;
        }
        iVar1 = snprintf((char *)(in_RDI + local_34),in_RSI - local_34,"%s",
                         *(undefined8 *)(in_RCX + (long)local_30 * 8));
        if ((iVar1 < 0) || ((ulong)(in_RSI - local_34) <= (ulong)(long)iVar1)) {
          return local_34;
        }
        local_34 = iVar1 + local_34;
        local_38 = local_38 + 1;
      }
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

static int snprintf_error_data(char *buf, size_t len, uint8_t err,
			       const char **arr, int arr_len)
{
	int i, n = 0, count = 0;

	if (!err || len <= 0)
		return 0;

	for (i = 0; i < arr_len; i++) {
		if (err & (1 << i)) {
			int tmp_n = 0;
			if (count) {
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, ",");
				if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
					return n;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", arr[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
				return n;
			}
			n += tmp_n;
			count++;
		}
	}

	return n;
}